

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int ARGBCopyYToAlpha(uint8_t *src_y,int src_stride_y,uint8_t *dst_argb,int dst_stride_argb,int width
                    ,int height)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  code *pcVar4;
  bool bVar5;
  int local_40;
  int local_3c;
  
  if ((height == 0 || width < 1) || (dst_argb == (uint8_t *)0x0 || src_y == (uint8_t *)0x0)) {
    iVar1 = -1;
  }
  else {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_y = src_y + ~height * src_stride_y;
      src_stride_y = -src_stride_y;
    }
    local_40 = src_stride_y;
    local_3c = dst_stride_argb;
    if (width * 4 == dst_stride_argb && src_stride_y == width) {
      width = iVar1 * width;
      iVar1 = 1;
      local_40 = 0;
      local_3c = 0;
    }
    iVar2 = libyuv::TestCpuFlag(0x20);
    if ((width & 7U) == 0) {
      pcVar4 = ARGBCopyYToAlphaRow_SSE2;
    }
    else {
      pcVar4 = ARGBCopyYToAlphaRow_Any_SSE2;
    }
    if (iVar2 == 0) {
      pcVar4 = ARGBCopyYToAlphaRow_C;
    }
    iVar2 = libyuv::TestCpuFlag(0x400);
    if ((width & 0xfU) == 0) {
      pcVar3 = ARGBCopyYToAlphaRow_AVX2;
    }
    else {
      pcVar3 = ARGBCopyYToAlphaRow_Any_AVX2;
    }
    if (iVar2 == 0) {
      pcVar3 = pcVar4;
    }
    while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
      (*pcVar3)(src_y,dst_argb,width);
      src_y = src_y + local_40;
      dst_argb = dst_argb + local_3c;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int ARGBCopyYToAlpha(const uint8_t* src_y,
                     int src_stride_y,
                     uint8_t* dst_argb,
                     int dst_stride_argb,
                     int width,
                     int height) {
  int y;
  void (*ARGBCopyYToAlphaRow)(const uint8_t* src_y, uint8_t* dst_argb,
                              int width) = ARGBCopyYToAlphaRow_C;
  if (!src_y || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_stride_y = -src_stride_y;
  }
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBCOPYYTOALPHAROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    ARGBCopyYToAlphaRow = ARGBCopyYToAlphaRow_Any_SSE2;
    if (IS_ALIGNED(width, 8)) {
      ARGBCopyYToAlphaRow = ARGBCopyYToAlphaRow_SSE2;
    }
  }
#endif
#if defined(HAS_ARGBCOPYYTOALPHAROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBCopyYToAlphaRow = ARGBCopyYToAlphaRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      ARGBCopyYToAlphaRow = ARGBCopyYToAlphaRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBCOPYYTOALPHAROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBCopyYToAlphaRow = ARGBCopyYToAlphaRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      ARGBCopyYToAlphaRow = ARGBCopyYToAlphaRow_MMI;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGBCopyYToAlphaRow(src_y, dst_argb, width);
    src_y += src_stride_y;
    dst_argb += dst_stride_argb;
  }
  return 0;
}